

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_memrchr32_63(UChar *s,UChar32 c,int32_t count)

{
  UChar trail;
  UChar *pUStack_28;
  UChar lead;
  UChar *limit;
  int32_t count_local;
  UChar32 c_local;
  UChar *s_local;
  
  if ((uint)c < 0x10000) {
    s_local = u_memrchr_63(s,(UChar)c,count);
  }
  else if (count < 2) {
    s_local = (UChar *)0x0;
  }
  else if ((uint)c < 0x110000) {
    pUStack_28 = s + (long)count + -1;
    do {
      if ((*pUStack_28 == ((UChar)c & 0x3ffU | 0xdc00U)) &&
         (pUStack_28[-1] == (UChar)((short)(c >> 10) + L'ퟀ'))) {
        return pUStack_28 + -1;
      }
      pUStack_28 = pUStack_28 + -1;
    } while (s != pUStack_28);
    s_local = (UChar *)0x0;
  }
  else {
    s_local = (UChar *)0x0;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memrchr32(const UChar *s, UChar32 c, int32_t count) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_memrchr(s, (UChar)c, count);
    } else if(count<2) {
        /* too short for a surrogate pair */
        return NULL;
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *limit=s+count-1;
        UChar lead=U16_LEAD(c), trail=U16_TRAIL(c);

        do {
            if(*limit==trail && *(limit-1)==lead) {
                return (UChar *)(limit-1);
            }
        } while(s!=--limit);
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}